

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_queue.hpp
# Opt level: O0

void __thiscall
cppurses::detail::Event_queue::View<(cppurses::Event::Type)0>::Move_iterator::Move_iterator
          (Move_iterator *this,Event_queue *queue)

{
  Queue_t *pQVar1;
  Size_t SVar2;
  Event_queue *queue_local;
  Move_iterator *this_local;
  
  this->mtx_ = &queue->mtx_;
  std::set<cppurses::Widget_*,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>::
  set(&this->already_sent_);
  pQVar1 = get_events(queue);
  this->events_ = pQVar1;
  SVar2 = find_next(this,0xffffffffffffffff);
  this->at_ = SVar2;
  return;
}

Assistant:

Move_iterator(Event_queue& queue)
                : mtx_{queue.mtx_},
                  events_{get_events(queue)},
                  at_{this->find_next(static_cast<Size_t>(-1))}
            {}